

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mylinkedList.h
# Opt level: O0

void __thiscall linkedList<char_*>::insert_last(linkedList<char_*> *this,char *data)

{
  bool bVar1;
  l_node<char_*> *this_00;
  l_node<char_*> *temp;
  char *data_local;
  linkedList<char_*> *this_local;
  
  this_00 = (l_node<char_*> *)operator_new(0x10);
  l_node<char_*>::l_node(this_00,data);
  this_00->next = (l_node<char_*> *)0x0;
  bVar1 = isEmpty(this);
  if (bVar1) {
    this->head = this_00;
    this->tail = this_00;
  }
  else {
    this->tail->next = this_00;
    this->tail = this_00;
  }
  this->size = this->size + 1;
  return;
}

Assistant:

void linkedList<T>::insert_last( T data)
{


    auto *temp =  new l_node<T>(data);//createNode(data);
    temp->next = nullptr;

    if (this->isEmpty()){
        head=temp;
        tail=temp;
    }
    else{

        tail->next = temp;
        tail = temp;
    }


    size++;

}